

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void sga_add_patch(void *alpha,Integer g_a,Integer *ailo,Integer *aihi,Integer *ajlo,Integer *ajhi,
                  void *beta,Integer g_b,Integer *bilo,Integer *bihi,Integer *bjlo,Integer *bjhi,
                  Integer g_c,Integer *cilo,Integer *cihi,Integer *cjlo,Integer *cjhi)

{
  Integer chi [2];
  Integer clo [2];
  Integer bhi [2];
  Integer blo [2];
  Integer ahi [2];
  Integer alo [2];
  Integer in_stack_00000c70;
  void *in_stack_00000c78;
  Integer *in_stack_00000c80;
  Integer *in_stack_00000c88;
  Integer in_stack_00000c90;
  void *in_stack_00000c98;
  Integer *in_stack_00000cb0;
  Integer *in_stack_00000cb8;
  Integer in_stack_00000cc0;
  Integer *in_stack_00000cc8;
  Integer *in_stack_00000cd0;
  
  pnga_add_patch(in_stack_00000c98,in_stack_00000c90,in_stack_00000c88,in_stack_00000c80,
                 in_stack_00000c78,in_stack_00000c70,in_stack_00000cb0,in_stack_00000cb8,
                 in_stack_00000cc0,in_stack_00000cc8,in_stack_00000cd0);
  return;
}

Assistant:

static void sga_add_patch(void *alpha, Integer g_a, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, void *beta, Integer g_b, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi, Integer g_c, Integer *cilo, Integer *cihi, Integer *cjlo, Integer *cjhi)
{
    Integer alo[2], ahi[2], blo[2], bhi[2], clo[2], chi[2];

    alo[0] = *ailo; alo[1] = *ajlo;
    ahi[0] = *aihi; ahi[1] = *ajhi;
    blo[0] = *bilo; blo[1] = *bjlo;
    bhi[0] = *bihi; bhi[1] = *bjhi;
    clo[0] = *cilo; clo[1] = *cjlo;
    chi[0] = *cihi; chi[1] = *cjhi;
    wnga_add_patch(alpha, g_a, alo, ahi, beta, g_b, blo, bhi, g_c, clo, chi);
}